

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int eval_unary_expr(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                   lyxp_set *set,int options)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  undefined1 local_a8 [8];
  lyxp_set set2;
  lyxp_set orig_set;
  uint uStack_40;
  uint16_t op_exp;
  int ret;
  int unary_minus;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t *exp_idx_local;
  lyxp_expr *exp_local;
  
  uStack_40 = 0xffffffff;
  while( true ) {
    iVar1 = exp_check_token(exp,*exp_idx,LYXP_TOKEN_OPERATOR_MATH,0);
    bVar4 = false;
    if (iVar1 == 0) {
      bVar4 = exp->expr[exp->expr_pos[*exp_idx]] == '-';
    }
    if (!bVar4) break;
    if (uStack_40 == 0xffffffff) {
      uStack_40 = (uint)*exp_idx;
    }
    else {
      uStack_40 = 0xffffffff;
    }
    if ('\x02' < ly_log_level) {
      pcVar2 = "skipped";
      if (set != (lyxp_set *)0x0) {
        pcVar2 = "parsed";
      }
      pcVar3 = print_token(exp->tokens[*exp_idx]);
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_unary_expr",pcVar2,pcVar3,
                 (ulong)exp->expr_pos[*exp_idx]);
    }
    *exp_idx = *exp_idx + 1;
  }
  memset(&set2.ctx_pos,0,0x30);
  memset(local_a8,0,0x30);
  orig_set.ctx_pos._2_2_ = exp_repeat_peek(exp,*exp_idx);
  if ((orig_set.ctx_pos._2_2_ == 0) ||
     (exp->tokens[orig_set.ctx_pos._2_2_] != LYXP_TOKEN_OPERATOR_UNI)) {
    orig_set.ctx_pos._2_2_ = 0;
  }
  else {
    exp_repeat_pop(exp,*exp_idx);
    set_fill_set((lyxp_set *)&set2.ctx_pos,set);
  }
  exp_local._4_4_ = eval_path_expr(exp,exp_idx,cur_node,param_4,set,options);
  if (exp_local._4_4_ == 0) {
    do {
      while( true ) {
        while( true ) {
          if (orig_set.ctx_pos._2_2_ == 0) {
            lyxp_set_cast((lyxp_set *)&set2.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
            if ((((set != (lyxp_set *)0x0) && (-1 < (int)uStack_40)) && ((options & 0x1cU) == 0)) &&
               (iVar1 = moveto_op_math(set,(lyxp_set *)0x0,exp->expr + exp->expr_pos[(int)uStack_40]
                                       ,cur_node,param_4,options), iVar1 != 0)) {
              return -1;
            }
            return 0;
          }
          if ('\x02' < ly_log_level) {
            pcVar2 = "skipped";
            if (set != (lyxp_set *)0x0) {
              pcVar2 = "parsed";
            }
            pcVar3 = print_token(exp->tokens[*exp_idx]);
            ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_unary_expr",pcVar2,pcVar3,
                       (ulong)exp->expr_pos[*exp_idx]);
          }
          *exp_idx = *exp_idx + 1;
          orig_set.ctx_pos._2_2_ = exp_repeat_peek(exp,*exp_idx);
          if ((orig_set.ctx_pos._2_2_ == 0) ||
             (exp->tokens[orig_set.ctx_pos._2_2_] != LYXP_TOKEN_OPERATOR_UNI)) {
            orig_set.ctx_pos._2_2_ = 0;
          }
          else {
            exp_repeat_pop(exp,*exp_idx);
          }
          if (set != (lyxp_set *)0x0) break;
          iVar1 = eval_path_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        set_fill_set((lyxp_set *)local_a8,(lyxp_set *)&set2.ctx_pos);
        iVar1 = eval_path_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)local_a8,options);
        if (iVar1 != 0) {
          lyxp_set_cast((lyxp_set *)&set2.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
          lyxp_set_cast((lyxp_set *)local_a8,LYXP_SET_EMPTY,cur_node,param_4,options);
          return iVar1;
        }
        if ((options & 0x1cU) == 0) break;
        set_snode_merge(set,(lyxp_set *)local_a8);
      }
      iVar1 = moveto_union(set,(lyxp_set *)local_a8,cur_node,options);
    } while (iVar1 == 0);
    lyxp_set_cast((lyxp_set *)&set2.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
    lyxp_set_cast((lyxp_set *)local_a8,LYXP_SET_EMPTY,cur_node,param_4,options);
    exp_local._4_4_ = -1;
  }
  else {
    lyxp_set_cast((lyxp_set *)&set2.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
  }
  return exp_local._4_4_;
}

Assistant:

static int
eval_unary_expr(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                struct lyxp_set *set, int options)
{
    int unary_minus, ret;
    uint16_t op_exp;
    struct lyxp_set orig_set, set2;

    /* ('-')* */
    unary_minus = -1;
    while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_MATH, 0)
            && (exp->expr[exp->expr_pos[*exp_idx]] == '-')) {
        if (unary_minus == -1) {
            unary_minus = *exp_idx;
        } else {
            /* double '-' makes '+', ignore */
            unary_minus = -1;
        }
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);
    }

    memset(&orig_set, 0, sizeof orig_set);
    memset(&set2, 0, sizeof set2);

    op_exp = exp_repeat_peek(exp, *exp_idx);
    if (op_exp && (exp->tokens[op_exp] == LYXP_TOKEN_OPERATOR_UNI)) {
        /* there is an operator */
        exp_repeat_pop(exp, *exp_idx);
        set_fill_set(&orig_set, set);
    } else {
        op_exp = 0;
    }

    /* PathExpr */
    ret = eval_path_expr(exp, exp_idx, cur_node, local_mod, set, options);
    if (ret) {
        lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
        return ret;
    }

    /* ('|' PathExpr)* */
    while (op_exp) {
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        op_exp = exp_repeat_peek(exp, *exp_idx);
        if (op_exp && (exp->tokens[op_exp] == LYXP_TOKEN_OPERATOR_UNI)) {
            /* there is another operator */
            exp_repeat_pop(exp, *exp_idx);
        } else {
            op_exp = 0;
        }

        if (!set) {
            ret = eval_path_expr(exp, exp_idx, cur_node, local_mod, NULL, options);
            if (ret) {
                return ret;
            }
            continue;
        }

        set_fill_set(&set2, &orig_set);
        ret = eval_path_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
        if (ret) {
            lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
            lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
            return ret;
        }

        /* eval */
        if (options & LYXP_SNODE_ALL) {
            set_snode_merge(set, &set2);
        } else if (moveto_union(set, &set2, cur_node, options)) {
            lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
            lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
            return -1;
        }
    }

    lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
    /* now we have all the unions in set and no other memory allocated */

    if (set && (unary_minus > -1) && !(options & LYXP_SNODE_ALL)) {
        if (moveto_op_math(set, NULL, &exp->expr[exp->expr_pos[unary_minus]], cur_node, local_mod, options)) {
            return -1;
        }
    }

    return EXIT_SUCCESS;
}